

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.h
# Opt level: O1

type * std::__detail::__variant::
       __gen_vtable_impl<std::__detail::__variant::_Multi_array<std::__detail::__variant::__deduce_visit_result<CScript>_(*)((anonymous_namespace)::CScriptVisitor_&&,_const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_&)>,_std::integer_sequence<unsigned_long,_0UL>_>
       ::__visit_invoke(type *__return_storage_ptr__,CScriptVisitor *__visitor,
                       variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *__vars)

{
  long in_FS_OFFSET;
  
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
              (&__return_storage_ptr__->super_CScriptBase,
               (prevector<28U,_unsigned_char,_unsigned_int,_int> *)__vars);
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CScript& push_int64(int64_t n)
    {
        if (n == -1 || (n >= 1 && n <= 16))
        {
            push_back(n + (OP_1 - 1));
        }
        else if (n == 0)
        {
            push_back(OP_0);
        }
        else
        {
            *this << CScriptNum::serialize(n);
        }
        return *this;
    }